

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjbench.c
# Opt level: O3

int decomp(uchar *srcBuf,uchar **jpegBuf,unsigned_long *jpegSize,uchar *dstBuf,int w,int h,
          int subsamp,int jpegQual,char *fileName,int tilew,int tileh)

{
  int height;
  uchar uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  tjhandle handle;
  char *pcVar14;
  long lVar15;
  unsigned_long __size;
  uchar *dstBuf_00;
  int *piVar16;
  int iVar17;
  char *pcVar18;
  ulong uVar19;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int len;
  uchar *puVar20;
  undefined8 uVar21;
  long lVar22;
  int iVar23;
  char *pcVar24;
  ulong uVar25;
  uchar *puVar26;
  uchar uVar27;
  uchar *puVar28;
  double dVar29;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar30;
  undefined1 auVar35 [16];
  double dVar31;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int local_534;
  double local_518;
  char sizeStr [24];
  char qualStr [13];
  char tempStr [1024];
  undefined1 auStack_38 [8];
  
  sizeStr[0x10] = '\0';
  sizeStr[0x11] = '\0';
  sizeStr[0x12] = '\0';
  sizeStr[0x13] = '\0';
  sizeStr[0x14] = '\0';
  sizeStr[0x15] = '\0';
  sizeStr[0x16] = '\0';
  sizeStr[0x17] = '\0';
  sizeStr[0] = '\0';
  sizeStr[1] = '\0';
  sizeStr[2] = '\0';
  sizeStr[3] = '\0';
  sizeStr[4] = '\0';
  sizeStr[5] = '\0';
  sizeStr[6] = '\0';
  sizeStr[7] = '\0';
  sizeStr[8] = '\0';
  sizeStr[9] = '\0';
  sizeStr[10] = '\0';
  sizeStr[0xb] = '\0';
  sizeStr[0xc] = '\0';
  sizeStr[0xd] = '\0';
  sizeStr[0xe] = '\0';
  sizeStr[0xf] = '\0';
  qualStr[8] = '\0';
  qualStr[9] = '\0';
  qualStr[10] = '\0';
  qualStr[0xb] = '\0';
  qualStr[0xc] = '\0';
  qualStr[0] = '\0';
  qualStr[1] = '\0';
  qualStr[2] = '\0';
  qualStr[3] = '\0';
  qualStr[4] = '\0';
  qualStr[5] = '\0';
  qualStr[6] = '\0';
  qualStr[7] = '\0';
  iVar13 = tjPixelSize[pf];
  iVar4 = (sf.num * w + sf.denom + -1) / sf.denom;
  iVar5 = (sf.denom + sf.num * h + -1) / sf.denom;
  iVar6 = (w + tilew + -1) / tilew;
  iVar7 = (h + tileh + -1) / tileh;
  if (0 < jpegQual) {
    snprintf(qualStr,0xd,"_Q%d");
  }
  qualStr[0xc] = '\0';
  handle = tjInitDecompress();
  if (handle == (tjhandle)0x0) {
    iVar8 = tjGetErrorCode((tjhandle)0x0);
    pcVar14 = tjGetErrorStr2((tjhandle)0x0);
    if ((flags & 0x2000U) != 0 || iVar8 != 0) {
      pcVar24 = "ERROR";
      if (iVar8 == 0) {
        pcVar24 = "WARNING";
      }
      dstBuf_00 = (uchar *)0x0;
      printf("%s in line %d while %s:\n%s\n",pcVar24,0xa2,"executing tjInitDecompress()",pcVar14);
      iVar6 = -1;
      goto LAB_0010ba4f;
    }
    iVar8 = strncmp(tjErrorStr,pcVar14,200);
    if ((((iVar8 != 0) ||
         (auVar39[0] = -(tjErrorMsg[0xd] == 'n'), auVar39[1] = -(tjErrorMsg[0xe] == 'i'),
         auVar39[2] = -(tjErrorMsg[0xf] == 't'), auVar39[3] = -(tjErrorMsg[0x10] == 'D'),
         auVar39[4] = -(tjErrorMsg[0x11] == 'e'), auVar39[5] = -(tjErrorMsg[0x12] == 'c'),
         auVar39[6] = -(tjErrorMsg[0x13] == 'o'), auVar39[7] = -(tjErrorMsg[0x14] == 'm'),
         auVar39[8] = -(tjErrorMsg[0x15] == 'p'), auVar39[9] = -(tjErrorMsg[0x16] == 'r'),
         auVar39[10] = -(tjErrorMsg[0x17] == 'e'), auVar39[0xb] = -(tjErrorMsg[0x18] == 's'),
         auVar39[0xc] = -(tjErrorMsg[0x19] == 's'), auVar39[0xd] = -(tjErrorMsg[0x1a] == '('),
         auVar39[0xe] = -(tjErrorMsg[0x1b] == ')'), auVar39[0xf] = -(tjErrorMsg[0x1c] == '\0'),
         auVar32[0] = -(tjErrorMsg[0] == 'e'), auVar32[1] = -(tjErrorMsg[1] == 'x'),
         auVar32[2] = -(tjErrorMsg[2] == 'e'), auVar32[3] = -(tjErrorMsg[3] == 'c'),
         auVar32[4] = -(tjErrorMsg[4] == 'u'), auVar32[5] = -(tjErrorMsg[5] == 't'),
         auVar32[6] = -(tjErrorMsg[6] == 'i'), auVar32[7] = -(tjErrorMsg[7] == 'n'),
         auVar32[8] = -(tjErrorMsg[8] == 'g'), auVar32[9] = -(tjErrorMsg[9] == ' '),
         auVar32[10] = -(tjErrorMsg[10] == 't'), auVar32[0xb] = -(tjErrorMsg[0xb] == 'j'),
         auVar32[0xc] = -(tjErrorMsg[0xc] == 'I'), auVar32[0xd] = -(tjErrorMsg[0xd] == 'n'),
         auVar32[0xe] = -(tjErrorMsg[0xe] == 'i'), auVar32[0xf] = -(tjErrorMsg[0xf] == 't'),
         auVar32 = auVar32 & auVar39,
         (ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) | (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar32[0xf] >> 7) << 0xf) != 0xffff)) || (tjErrorCode != 0)) ||
       (tjErrorLine != 0xa2)) {
      strncpy(tjErrorStr,pcVar14,199);
      strncpy(tjErrorMsg,"executing tjInitDecompress()",199);
      tjErrorCode = 0;
      tjErrorLine = 0xa2;
      printf("WARNING in line %d while %s:\n%s\n",0xa2,"executing tjInitDecompress()",pcVar14);
    }
  }
  iVar8 = iVar4 * iVar13;
  lVar15 = (long)iVar8;
  bVar3 = false;
  if (dstBuf == (uchar *)0x0) {
    dstBuf = (uchar *)malloc(iVar5 * lVar15);
    if (dstBuf != (uchar *)0x0) {
      bVar3 = true;
      goto LAB_0010af8f;
    }
    piVar16 = __errno_location();
    pcVar14 = strerror(*piVar16);
    dstBuf_00 = (uchar *)0x0;
    printf("ERROR in line %d while %s:\n%s\n",0xa9,"allocating destination buffer",pcVar14);
    bVar3 = false;
    dstBuf = (uchar *)0x0;
LAB_0010ba31:
    iVar6 = -1;
    if (handle != (tjhandle)0x0) {
      tjDestroy(handle);
    }
  }
  else {
LAB_0010af8f:
    memset(dstBuf,0x7f,iVar5 * lVar15);
    if (doYUV == 0) {
      dstBuf_00 = (uchar *)0x0;
    }
    else {
      iVar9 = tileh;
      iVar23 = tilew;
      if (doTile == 0) {
        iVar9 = iVar5;
        iVar23 = iVar4;
      }
      __size = tjBufSizeYUV2(iVar23,yuvPad,iVar9,subsamp);
      if (__size == 0xffffffffffffffff) {
        iVar9 = tjGetErrorCode(handle);
        pcVar14 = tjGetErrorStr2(handle);
        if ((flags & 0x2000U) != 0 || iVar9 != 0) {
          pcVar24 = "ERROR";
          if (iVar9 == 0) {
            pcVar24 = "WARNING";
          }
          dstBuf_00 = (uchar *)0x0;
          printf("%s in line %d while %s:\n%s\n",pcVar24,0xb6,"allocating YUV buffer",pcVar14);
          goto LAB_0010ba31;
        }
        iVar9 = strncmp(tjErrorStr,pcVar14,200);
        if (((iVar9 != 0) ||
            (auVar40[0] = -(tjErrorMsg[6] == 't'), auVar40[1] = -(tjErrorMsg[7] == 'i'),
            auVar40[2] = -(tjErrorMsg[8] == 'n'), auVar40[3] = -(tjErrorMsg[9] == 'g'),
            auVar40[4] = -(tjErrorMsg[10] == ' '), auVar40[5] = -(tjErrorMsg[0xb] == 'Y'),
            auVar40[6] = -(tjErrorMsg[0xc] == 'U'), auVar40[7] = -(tjErrorMsg[0xd] == 'V'),
            auVar40[8] = -(tjErrorMsg[0xe] == ' '), auVar40[9] = -(tjErrorMsg[0xf] == 'b'),
            auVar40[10] = -(tjErrorMsg[0x10] == 'u'), auVar40[0xb] = -(tjErrorMsg[0x11] == 'f'),
            auVar40[0xc] = -(tjErrorMsg[0x12] == 'f'), auVar40[0xd] = -(tjErrorMsg[0x13] == 'e'),
            auVar40[0xe] = -(tjErrorMsg[0x14] == 'r'), auVar40[0xf] = -(tjErrorMsg[0x15] == '\0'),
            auVar33[0] = -(tjErrorMsg[0] == 'a'), auVar33[1] = -(tjErrorMsg[1] == 'l'),
            auVar33[2] = -(tjErrorMsg[2] == 'l'), auVar33[3] = -(tjErrorMsg[3] == 'o'),
            auVar33[4] = -(tjErrorMsg[4] == 'c'), auVar33[5] = -(tjErrorMsg[5] == 'a'),
            auVar33[6] = -(tjErrorMsg[6] == 't'), auVar33[7] = -(tjErrorMsg[7] == 'i'),
            auVar33[8] = -(tjErrorMsg[8] == 'n'), auVar33[9] = -(tjErrorMsg[9] == 'g'),
            auVar33[10] = -(tjErrorMsg[10] == ' '), auVar33[0xb] = -(tjErrorMsg[0xb] == 'Y'),
            auVar33[0xc] = -(tjErrorMsg[0xc] == 'U'), auVar33[0xd] = -(tjErrorMsg[0xd] == 'V'),
            auVar33[0xe] = -(tjErrorMsg[0xe] == ' '), auVar33[0xf] = -(tjErrorMsg[0xf] == 'b'),
            auVar33 = auVar33 & auVar40,
            (ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar33[0xf] >> 7) << 0xf) != 0xffff)) ||
           ((tjErrorCode != 0 || (tjErrorLine != 0xb6)))) {
          strncpy(tjErrorStr,pcVar14,199);
          strncpy(tjErrorMsg,"allocating YUV buffer",199);
          tjErrorCode = 0;
          tjErrorLine = 0xb6;
          printf("WARNING in line %d while %s:\n%s\n",0xb6,"allocating YUV buffer",pcVar14);
        }
      }
      dstBuf_00 = (uchar *)malloc(__size);
      if (dstBuf_00 == (uchar *)0x0) {
        piVar16 = __errno_location();
        pcVar14 = strerror(*piVar16);
        dstBuf_00 = (uchar *)0x0;
        printf("ERROR in line %d while %s:\n%s\n",0xb8,"allocating YUV buffer",pcVar14);
        goto LAB_0010ba31;
      }
      memset(dstBuf_00,0x7f,__size);
    }
    local_534 = -1;
    local_518 = 0.0;
    dVar38 = 0.0;
LAB_0010b16a:
    do {
      dVar29 = getTime();
      if (0 < iVar7) {
        iVar9 = 0;
        iVar23 = 0;
        puVar20 = dstBuf;
        do {
          if (0 < iVar6) {
            iVar17 = h - iVar9 * tileh;
            if (tileh <= iVar17) {
              iVar17 = tileh;
            }
            lVar22 = 0;
            puVar28 = puVar20;
            iVar10 = w;
            do {
              iVar12 = iVar10;
              if (tilew <= iVar10) {
                iVar12 = tilew;
              }
              height = iVar17;
              if (doTile == 0) {
                height = iVar5;
                iVar12 = iVar4;
              }
              if (doYUV == 0) {
                iVar12 = tjDecompress2(handle,jpegBuf[iVar23 + lVar22],jpegSize[iVar23 + lVar22],
                                       puVar28,iVar12,iVar8,height,pf,flags);
                if (iVar12 == -1) {
                  iVar12 = tjGetErrorCode(handle);
                  pcVar14 = tjGetErrorStr2(handle);
                  if ((flags & 0x2000U) != 0 || iVar12 != 0) {
                    pcVar24 = "ERROR";
                    if (iVar12 == 0) {
                      pcVar24 = "WARNING";
                    }
                    pcVar18 = "executing tjDecompress2()";
                    uVar21 = 0xd8;
                    goto LAB_0010b9d7;
                  }
                  iVar12 = strncmp(tjErrorStr,pcVar14,200);
                  if (((iVar12 != 0) ||
                      (auVar36[0] = -(tjErrorMsg[10] == 't'), auVar36[1] = -(tjErrorMsg[0xb] == 'j')
                      , auVar36[2] = -(tjErrorMsg[0xc] == 'D'),
                      auVar36[3] = -(tjErrorMsg[0xd] == 'e'), auVar36[4] = -(tjErrorMsg[0xe] == 'c')
                      , auVar36[5] = -(tjErrorMsg[0xf] == 'o'),
                      auVar36[6] = -(tjErrorMsg[0x10] == 'm'),
                      auVar36[7] = -(tjErrorMsg[0x11] == 'p'),
                      auVar36[8] = -(tjErrorMsg[0x12] == 'r'),
                      auVar36[9] = -(tjErrorMsg[0x13] == 'e'),
                      auVar36[10] = -(tjErrorMsg[0x14] == 's'),
                      auVar36[0xb] = -(tjErrorMsg[0x15] == 's'),
                      auVar36[0xc] = -(tjErrorMsg[0x16] == '2'),
                      auVar36[0xd] = -(tjErrorMsg[0x17] == '('),
                      auVar36[0xe] = -(tjErrorMsg[0x18] == ')'),
                      auVar36[0xf] = -(tjErrorMsg[0x19] == '\0'),
                      auVar43[0] = -(tjErrorMsg[0] == 'e'), auVar43[1] = -(tjErrorMsg[1] == 'x'),
                      auVar43[2] = -(tjErrorMsg[2] == 'e'), auVar43[3] = -(tjErrorMsg[3] == 'c'),
                      auVar43[4] = -(tjErrorMsg[4] == 'u'), auVar43[5] = -(tjErrorMsg[5] == 't'),
                      auVar43[6] = -(tjErrorMsg[6] == 'i'), auVar43[7] = -(tjErrorMsg[7] == 'n'),
                      auVar43[8] = -(tjErrorMsg[8] == 'g'), auVar43[9] = -(tjErrorMsg[9] == ' '),
                      auVar43[10] = -(tjErrorMsg[10] == 't'),
                      auVar43[0xb] = -(tjErrorMsg[0xb] == 'j'),
                      auVar43[0xc] = -(tjErrorMsg[0xc] == 'D'),
                      auVar43[0xd] = -(tjErrorMsg[0xd] == 'e'),
                      auVar43[0xe] = -(tjErrorMsg[0xe] == 'c'),
                      auVar43[0xf] = -(tjErrorMsg[0xf] == 'o'), auVar43 = auVar43 & auVar36,
                      (ushort)((ushort)(SUB161(auVar43 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar43[0xf] >> 7) << 0xf) != 0xffff)) ||
                     ((tjErrorCode != 0 || (tjErrorLine != 0xd8)))) {
                    strncpy(tjErrorStr,pcVar14,199);
                    strncpy(tjErrorMsg,"executing tjDecompress2()",199);
                    tjErrorCode = 0;
                    tjErrorLine = 0xd8;
                    printf("WARNING in line %d while %s:\n%s\n",0xd8,"executing tjDecompress2()",
                           pcVar14);
                  }
                }
              }
              else {
                iVar11 = tjDecompressToYUV2(handle,jpegBuf[iVar23 + lVar22],
                                            jpegSize[iVar23 + lVar22],dstBuf_00,iVar12,yuvPad,height
                                            ,flags);
                if (iVar11 == -1) {
                  iVar11 = tjGetErrorCode(handle);
                  pcVar14 = tjGetErrorStr2(handle);
                  if ((flags & 0x2000U) != 0 || iVar11 != 0) {
                    pcVar24 = "ERROR";
                    if (iVar11 == 0) {
                      pcVar24 = "WARNING";
                    }
                    pcVar18 = "executing tjDecompressToYUV2()";
                    uVar21 = 0xcf;
LAB_0010b9d7:
                    printf("%s in line %d while %s:\n%s\n",pcVar24,uVar21,pcVar18,pcVar14);
                    goto LAB_0010ba31;
                  }
                  iVar11 = strncmp(tjErrorStr,pcVar14,200);
                  if ((((iVar11 != 0) ||
                       (auVar34[0] = -(tjErrorMsg[0xf] == 'o'),
                       auVar34[1] = -(tjErrorMsg[0x10] == 'm'),
                       auVar34[2] = -(tjErrorMsg[0x11] == 'p'),
                       auVar34[3] = -(tjErrorMsg[0x12] == 'r'),
                       auVar34[4] = -(tjErrorMsg[0x13] == 'e'),
                       auVar34[5] = -(tjErrorMsg[0x14] == 's'),
                       auVar34[6] = -(tjErrorMsg[0x15] == 's'),
                       auVar34[7] = -(tjErrorMsg[0x16] == 'T'),
                       auVar34[8] = -(tjErrorMsg[0x17] == 'o'),
                       auVar34[9] = -(tjErrorMsg[0x18] == 'Y'),
                       auVar34[10] = -(tjErrorMsg[0x19] == 'U'),
                       auVar34[0xb] = -(tjErrorMsg[0x1a] == 'V'),
                       auVar34[0xc] = -(tjErrorMsg[0x1b] == '2'),
                       auVar34[0xd] = -(tjErrorMsg[0x1c] == '('),
                       auVar34[0xe] = -(tjErrorMsg[0x1d] == ')'),
                       auVar34[0xf] = -(tjErrorMsg[0x1e] == '\0'),
                       auVar41[0] = -(tjErrorMsg[0] == 'e'), auVar41[1] = -(tjErrorMsg[1] == 'x'),
                       auVar41[2] = -(tjErrorMsg[2] == 'e'), auVar41[3] = -(tjErrorMsg[3] == 'c'),
                       auVar41[4] = -(tjErrorMsg[4] == 'u'), auVar41[5] = -(tjErrorMsg[5] == 't'),
                       auVar41[6] = -(tjErrorMsg[6] == 'i'), auVar41[7] = -(tjErrorMsg[7] == 'n'),
                       auVar41[8] = -(tjErrorMsg[8] == 'g'), auVar41[9] = -(tjErrorMsg[9] == ' '),
                       auVar41[10] = -(tjErrorMsg[10] == 't'),
                       auVar41[0xb] = -(tjErrorMsg[0xb] == 'j'),
                       auVar41[0xc] = -(tjErrorMsg[0xc] == 'D'),
                       auVar41[0xd] = -(tjErrorMsg[0xd] == 'e'),
                       auVar41[0xe] = -(tjErrorMsg[0xe] == 'c'),
                       auVar41[0xf] = -(tjErrorMsg[0xf] == 'o'), auVar41 = auVar41 & auVar34,
                       (ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe |
                               (ushort)(byte)(auVar41[0xf] >> 7) << 0xf) != 0xffff)) ||
                      (tjErrorCode != 0)) || (tjErrorLine != 0xcf)) {
                    strncpy(tjErrorStr,pcVar14,199);
                    strncpy(tjErrorMsg,"executing tjDecompressToYUV2()",199);
                    tjErrorCode = 0;
                    tjErrorLine = 0xcf;
                    printf("WARNING in line %d while %s:\n%s\n",0xcf,
                           "executing tjDecompressToYUV2()",pcVar14);
                  }
                }
                dVar30 = getTime();
                iVar12 = tjDecodeYUV(handle,dstBuf_00,yuvPad,subsamp,puVar28,iVar12,iVar8,height,pf,
                                     flags);
                if (iVar12 == -1) {
                  iVar12 = tjGetErrorCode(handle);
                  pcVar14 = tjGetErrorStr2(handle);
                  if ((flags & 0x2000U) != 0 || iVar12 != 0) {
                    pcVar24 = "ERROR";
                    if (iVar12 == 0) {
                      pcVar24 = "WARNING";
                    }
                    printf("%s in line %d while %s:\n%s\n",pcVar24,0xd3,"executing tjDecodeYUV()",
                           pcVar14);
                    goto LAB_0010ba31;
                  }
                  iVar12 = strncmp(tjErrorStr,pcVar14,200);
                  if (((iVar12 != 0) ||
                      (auVar35[0] = -(tjErrorMsg[0x10] == 'd'),
                      auVar35[1] = -(tjErrorMsg[0x11] == 'e'),
                      auVar35[2] = -(tjErrorMsg[0x12] == 'Y'),
                      auVar35[3] = -(tjErrorMsg[0x13] == 'U'),
                      auVar35[4] = -(tjErrorMsg[0x14] == 'V'),
                      auVar35[5] = -(tjErrorMsg[0x15] == '('),
                      auVar35[6] = -(tjErrorMsg[0x16] == ')'),
                      auVar35[7] = -(tjErrorMsg[0x17] == '\0'), auVar35[8] = 0xff, auVar35[9] = 0xff
                      , auVar35[10] = 0xff, auVar35[0xb] = 0xff, auVar35[0xc] = 0xff,
                      auVar35[0xd] = 0xff, auVar35[0xe] = 0xff, auVar35[0xf] = 0xff,
                      auVar42[0] = -(tjErrorMsg[0] == 'e'), auVar42[1] = -(tjErrorMsg[1] == 'x'),
                      auVar42[2] = -(tjErrorMsg[2] == 'e'), auVar42[3] = -(tjErrorMsg[3] == 'c'),
                      auVar42[4] = -(tjErrorMsg[4] == 'u'), auVar42[5] = -(tjErrorMsg[5] == 't'),
                      auVar42[6] = -(tjErrorMsg[6] == 'i'), auVar42[7] = -(tjErrorMsg[7] == 'n'),
                      auVar42[8] = -(tjErrorMsg[8] == 'g'), auVar42[9] = -(tjErrorMsg[9] == ' '),
                      auVar42[10] = -(tjErrorMsg[10] == 't'),
                      auVar42[0xb] = -(tjErrorMsg[0xb] == 'j'),
                      auVar42[0xc] = -(tjErrorMsg[0xc] == 'D'),
                      auVar42[0xd] = -(tjErrorMsg[0xd] == 'e'),
                      auVar42[0xe] = -(tjErrorMsg[0xe] == 'c'),
                      auVar42[0xf] = -(tjErrorMsg[0xf] == 'o'), auVar42 = auVar42 & auVar35,
                      (ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar42[0xf] >> 7) << 0xf) != 0xffff)) ||
                     ((tjErrorCode != 0 || (tjErrorLine != 0xd3)))) {
                    strncpy(tjErrorStr,pcVar14,199);
                    strncpy(tjErrorMsg,"executing tjDecodeYUV()",199);
                    tjErrorCode = 0;
                    tjErrorLine = 0xd3;
                    printf("WARNING in line %d while %s:\n%s\n",0xd3,"executing tjDecodeYUV()",
                           pcVar14);
                  }
                }
                if (-1 < local_534) {
                  dVar31 = getTime();
                  local_518 = local_518 + (dVar31 - dVar30);
                }
              }
              puVar28 = puVar28 + iVar13 * tilew;
              lVar22 = lVar22 + 1;
              iVar10 = iVar10 - tilew;
            } while (iVar6 != (int)lVar22);
            iVar23 = iVar23 + (int)lVar22;
          }
          iVar9 = iVar9 + 1;
          puVar20 = puVar20 + tileh * lVar15;
        } while (iVar9 != iVar7);
      }
      dVar30 = getTime();
      dVar38 = dVar38 + (dVar30 - dVar29);
      if (local_534 < 0) {
        if (warmup <= dVar38) {
          local_534 = 0;
          dVar38 = 0.0;
          local_518 = 0.0;
        }
        goto LAB_0010b16a;
      }
      local_534 = local_534 + 1;
    } while (dVar38 < benchTime);
    if (doYUV != 0) {
      dVar38 = dVar38 - local_518;
    }
    iVar7 = tjDestroy(handle);
    iVar6 = extraout_EDX;
    if (iVar7 == -1) {
      iVar6 = tjGetErrorCode(handle);
      pcVar14 = tjGetErrorStr2(handle);
      if ((flags & 0x2000U) != 0 || iVar6 != 0) {
        pcVar24 = "ERROR";
        if (iVar6 == 0) {
          pcVar24 = "WARNING";
        }
        printf("%s in line %d while %s:\n%s\n",pcVar24,0xe6,"executing tjDestroy()",pcVar14);
        goto LAB_0010ba31;
      }
      iVar6 = strncmp(tjErrorStr,pcVar14,200);
      if (((iVar6 != 0) ||
          (auVar44[0] = -(tjErrorMsg[6] == 'i'), auVar44[1] = -(tjErrorMsg[7] == 'n'),
          auVar44[2] = -(tjErrorMsg[8] == 'g'), auVar44[3] = -(tjErrorMsg[9] == ' '),
          auVar44[4] = -(tjErrorMsg[10] == 't'), auVar44[5] = -(tjErrorMsg[0xb] == 'j'),
          auVar44[6] = -(tjErrorMsg[0xc] == 'D'), auVar44[7] = -(tjErrorMsg[0xd] == 'e'),
          auVar44[8] = -(tjErrorMsg[0xe] == 's'), auVar44[9] = -(tjErrorMsg[0xf] == 't'),
          auVar44[10] = -(tjErrorMsg[0x10] == 'r'), auVar44[0xb] = -(tjErrorMsg[0x11] == 'o'),
          auVar44[0xc] = -(tjErrorMsg[0x12] == 'y'), auVar44[0xd] = -(tjErrorMsg[0x13] == '('),
          auVar44[0xe] = -(tjErrorMsg[0x14] == ')'), auVar44[0xf] = -(tjErrorMsg[0x15] == '\0'),
          auVar37[0] = -(tjErrorMsg[0] == 'e'), auVar37[1] = -(tjErrorMsg[1] == 'x'),
          auVar37[2] = -(tjErrorMsg[2] == 'e'), auVar37[3] = -(tjErrorMsg[3] == 'c'),
          auVar37[4] = -(tjErrorMsg[4] == 'u'), auVar37[5] = -(tjErrorMsg[5] == 't'),
          auVar37[6] = -(tjErrorMsg[6] == 'i'), auVar37[7] = -(tjErrorMsg[7] == 'n'),
          auVar37[8] = -(tjErrorMsg[8] == 'g'), auVar37[9] = -(tjErrorMsg[9] == ' '),
          auVar37[10] = -(tjErrorMsg[10] == 't'), auVar37[0xb] = -(tjErrorMsg[0xb] == 'j'),
          auVar37[0xc] = -(tjErrorMsg[0xc] == 'D'), auVar37[0xd] = -(tjErrorMsg[0xd] == 'e'),
          auVar37[0xe] = -(tjErrorMsg[0xe] == 's'), auVar37[0xf] = -(tjErrorMsg[0xf] == 't'),
          auVar37 = auVar37 & auVar44,
          (ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar37[0xf] >> 7) << 0xf) != 0xffff)) ||
         ((tjErrorCode != 0 || (iVar6 = extraout_EDX_00, tjErrorLine != 0xe6)))) {
        strncpy(tjErrorStr,pcVar14,199);
        strncpy(tjErrorMsg,"executing tjDestroy()",199);
        tjErrorCode = 0;
        tjErrorLine = 0xe6;
        printf("WARNING in line %d while %s:\n%s\n",0xe6,"executing tjDestroy()",pcVar14);
        iVar6 = extraout_EDX_01;
      }
    }
    dVar29 = (double)local_534;
    if (quiet == 0) {
      pcVar14 = "Decomp to YUV";
      if (doYUV == 0) {
        pcVar14 = "Decompress   ";
      }
      printf("%s --> Frame rate:         %f fps\n",dVar29 / dVar38,pcVar14);
      dVar30 = ((double)(h * w) / 1000000.0) * dVar29;
      printf("                  Throughput:         %f Megapixels/sec\n",dVar30 / dVar38);
      if (doYUV != 0) {
        printf("YUV Decode    --> Frame rate:         %f fps\n",dVar29 / local_518);
        printf("                  Throughput:         %f Megapixels/sec\n",dVar30 / local_518);
      }
    }
    else {
      dVar29 = ((double)(h * w) / 1000000.0) * dVar29;
      sigfig(dVar29 / dVar38,(int)tempStr,&c_derived_tbl_ehufsi,iVar6);
      pcVar14 = "  ";
      if (quiet == 2) {
        pcVar14 = "\n";
      }
      printf("%-6s%s",tempStr,pcVar14);
      if (doYUV == 0) {
        if (quiet != 2) {
          putchar(10);
        }
      }
      else {
        sigfig(dVar29 / local_518,(int)tempStr,&c_derived_tbl_ehufsi,len);
        puts(tempStr);
      }
    }
    if (doWrite == 0) {
      iVar6 = 0;
    }
    else {
      if (sf.denom == 1 && sf.num == 1) {
        if (tileh != h || tilew != w) {
          pcVar14 = "%dx%d";
          goto LAB_0010bc32;
        }
        auVar2._11_5_ = 0;
        auVar2[0] = sizeStr[5];
        auVar2[1] = sizeStr[6];
        auVar2[2] = sizeStr[7];
        auVar2[3] = sizeStr[8];
        auVar2[4] = sizeStr[9];
        auVar2[5] = sizeStr[10];
        auVar2[6] = sizeStr[0xb];
        auVar2[7] = sizeStr[0xc];
        auVar2[8] = sizeStr[0xd];
        auVar2[9] = sizeStr[0xe];
        auVar2[10] = sizeStr[0xf];
        sizeStr._0_16_ = auVar2 << 0x28;
        builtin_strncpy(sizeStr,"full",4);
      }
      else {
        pcVar14 = "%d_%d";
        tilew = sf.num;
LAB_0010bc32:
        snprintf(sizeStr,0x18,pcVar14,(ulong)(uint)tilew);
      }
      if (decompOnly == 0) {
        snprintf(tempStr,0x400,"%s_%s%s_%s.%s",fileName,subName[subsamp],qualStr,sizeStr,ext);
      }
      else {
        snprintf(tempStr,0x400,"%s_%s.%s",fileName,sizeStr,ext);
      }
      iVar6 = 0;
      iVar4 = tjSaveImage(tempStr,dstBuf,iVar4,0,iVar5,pf,flags);
      if (iVar4 == -1) {
        pcVar14 = tjGetErrorStr2((tjhandle)0x0);
        printf("ERROR in line %d while %s:\n%s\n",0x10e,"saving bitmap",pcVar14);
        iVar6 = -1;
      }
      else {
        pcVar14 = strrchr(tempStr,0x2e);
        snprintf(pcVar14,(size_t)(auStack_38 + -(long)pcVar14),"-err.%s");
        if (((srcBuf != (uchar *)0x0) && (sf.num == 1)) && (sf.denom == 1)) {
          if (quiet == 0) {
            printf("Compression error written to %s.\n",tempStr);
          }
          if (subsamp == 3) {
            if (0 < h) {
              iVar4 = 0;
              puVar20 = dstBuf;
              do {
                puVar28 = puVar20;
                puVar26 = srcBuf;
                iVar5 = w;
                if (0 < w) {
                  do {
                    lVar22 = (long)pf;
                    iVar6 = tjRedOffset[lVar22];
                    iVar7 = tjGreenOffset[lVar22];
                    iVar8 = tjBlueOffset[lVar22];
                    iVar9 = (int)((double)puVar26[iVar8] * 0.114 +
                                  (double)puVar26[iVar6] * 0.299 + (double)puVar26[iVar7] * 0.587 +
                                 0.5);
                    if (0xfe < iVar9) {
                      iVar9 = 0xff;
                    }
                    if (iVar9 < 1) {
                      iVar9 = 0;
                    }
                    uVar1 = (uchar)((uint)puVar28[iVar6] - iVar9);
                    uVar27 = -uVar1;
                    if (0 < (int)((uint)puVar28[iVar6] - iVar9)) {
                      uVar27 = uVar1;
                    }
                    puVar28[iVar6] = uVar27;
                    uVar1 = (uchar)((uint)puVar28[iVar7] - iVar9);
                    uVar27 = -uVar1;
                    if (0 < (int)((uint)puVar28[iVar7] - iVar9)) {
                      uVar27 = uVar1;
                    }
                    puVar28[iVar7] = uVar27;
                    iVar9 = (uint)puVar28[iVar8] - iVar9;
                    iVar6 = -iVar9;
                    if (0 < iVar9) {
                      iVar6 = iVar9;
                    }
                    puVar28[iVar8] = (uchar)iVar6;
                    iVar5 = iVar5 + -1;
                    puVar28 = puVar28 + iVar13;
                    puVar26 = puVar26 + iVar13;
                  } while (iVar5 != 0);
                }
                iVar4 = iVar4 + 1;
                srcBuf = srcBuf + lVar15;
                puVar20 = puVar20 + lVar15;
              } while (iVar4 != h);
            }
          }
          else if (0 < h) {
            uVar19 = 0;
            puVar20 = dstBuf;
            do {
              if (0 < iVar13 * w) {
                uVar25 = 0;
                do {
                  uVar1 = (uchar)((uint)puVar20[uVar25] - (uint)srcBuf[uVar25]);
                  uVar27 = -uVar1;
                  if (0 < (int)((uint)puVar20[uVar25] - (uint)srcBuf[uVar25])) {
                    uVar27 = uVar1;
                  }
                  puVar20[uVar25] = uVar27;
                  uVar25 = uVar25 + 1;
                } while ((uint)(iVar13 * w) != uVar25);
              }
              uVar19 = uVar19 + 1;
              puVar20 = puVar20 + lVar15;
              srcBuf = srcBuf + lVar15;
            } while (uVar19 != (uint)h);
          }
          iVar6 = 0;
          iVar13 = tjSaveImage(tempStr,dstBuf,w,0,h,pf,flags);
          if (iVar13 == -1) {
            pcVar14 = tjGetErrorStr2((tjhandle)0x0);
            printf("ERROR in line %d while %s:\n%s\n",0x12d,"saving bitmap",pcVar14);
            iVar6 = -1;
          }
        }
      }
    }
  }
  if (bVar3) {
    free(dstBuf);
  }
LAB_0010ba4f:
  free(dstBuf_00);
  return iVar6;
}

Assistant:

static int decomp(unsigned char *srcBuf, unsigned char **jpegBuf,
                  unsigned long *jpegSize, unsigned char *dstBuf, int w, int h,
                  int subsamp, int jpegQual, char *fileName, int tilew,
                  int tileh)
{
  char tempStr[1024], sizeStr[24] = "\0", qualStr[13] = "\0", *ptr;
  FILE *file = NULL;
  tjhandle handle = NULL;
  int row, col, iter = 0, dstBufAlloc = 0, retval = 0;
  double elapsed, elapsedDecode;
  int ps = tjPixelSize[pf];
  int scaledw = TJSCALED(w, sf);
  int scaledh = TJSCALED(h, sf);
  int pitch = scaledw * ps;
  int ntilesw = (w + tilew - 1) / tilew, ntilesh = (h + tileh - 1) / tileh;
  unsigned char *dstPtr, *dstPtr2, *yuvBuf = NULL;

  if (jpegQual > 0) {
    snprintf(qualStr, 13, "_Q%d", jpegQual);
    qualStr[12] = 0;
  }

  if ((handle = tjInitDecompress()) == NULL)
    THROW_TJ("executing tjInitDecompress()");

  if (dstBuf == NULL) {
    if ((unsigned long long)pitch * (unsigned long long)scaledh >
        (unsigned long long)((size_t)-1))
      THROW("allocating destination buffer", "Image is too large");
    if ((dstBuf = (unsigned char *)malloc((size_t)pitch * scaledh)) == NULL)
      THROW_UNIX("allocating destination buffer");
    dstBufAlloc = 1;
  }
  /* Set the destination buffer to gray so we know whether the decompressor
     attempted to write to it */
  memset(dstBuf, 127, (size_t)pitch * scaledh);

  if (doYUV) {
    int width = doTile ? tilew : scaledw;
    int height = doTile ? tileh : scaledh;
    unsigned long yuvSize = tjBufSizeYUV2(width, yuvPad, height, subsamp);

    if (yuvSize == (unsigned long)-1)
      THROW_TJ("allocating YUV buffer");
    if ((yuvBuf = (unsigned char *)malloc(yuvSize)) == NULL)
      THROW_UNIX("allocating YUV buffer");
    memset(yuvBuf, 127, yuvSize);
  }

  /* Benchmark */
  iter = -1;
  elapsed = elapsedDecode = 0.;
  while (1) {
    int tile = 0;
    double start = getTime();

    for (row = 0, dstPtr = dstBuf; row < ntilesh;
         row++, dstPtr += (size_t)pitch * tileh) {
      for (col = 0, dstPtr2 = dstPtr; col < ntilesw;
           col++, tile++, dstPtr2 += ps * tilew) {
        int width = doTile ? min(tilew, w - col * tilew) : scaledw;
        int height = doTile ? min(tileh, h - row * tileh) : scaledh;

        if (doYUV) {
          double startDecode;

          if (tjDecompressToYUV2(handle, jpegBuf[tile], jpegSize[tile], yuvBuf,
                                 width, yuvPad, height, flags) == -1)
            THROW_TJ("executing tjDecompressToYUV2()");
          startDecode = getTime();
          if (tjDecodeYUV(handle, yuvBuf, yuvPad, subsamp, dstPtr2, width,
                          pitch, height, pf, flags) == -1)
            THROW_TJ("executing tjDecodeYUV()");
          if (iter >= 0) elapsedDecode += getTime() - startDecode;
        } else if (tjDecompress2(handle, jpegBuf[tile], jpegSize[tile],
                                 dstPtr2, width, pitch, height, pf,
                                 flags) == -1)
          THROW_TJ("executing tjDecompress2()");
      }
    }
    elapsed += getTime() - start;
    if (iter >= 0) {
      iter++;
      if (elapsed >= benchTime) break;
    } else if (elapsed >= warmup) {
      iter = 0;
      elapsed = elapsedDecode = 0.;
    }
  }
  if (doYUV) elapsed -= elapsedDecode;

  if (tjDestroy(handle) == -1) THROW_TJ("executing tjDestroy()");
  handle = NULL;

  if (quiet) {
    printf("%-6s%s",
           sigfig((double)(w * h) / 1000000. * (double)iter / elapsed, 4,
                  tempStr, 1024),
           quiet == 2 ? "\n" : "  ");
    if (doYUV)
      printf("%s\n",
             sigfig((double)(w * h) / 1000000. * (double)iter / elapsedDecode,
                    4, tempStr, 1024));
    else if (quiet != 2) printf("\n");
  } else {
    printf("%s --> Frame rate:         %f fps\n",
           doYUV ? "Decomp to YUV" : "Decompress   ", (double)iter / elapsed);
    printf("                  Throughput:         %f Megapixels/sec\n",
           (double)(w * h) / 1000000. * (double)iter / elapsed);
    if (doYUV) {
      printf("YUV Decode    --> Frame rate:         %f fps\n",
             (double)iter / elapsedDecode);
      printf("                  Throughput:         %f Megapixels/sec\n",
             (double)(w * h) / 1000000. * (double)iter / elapsedDecode);
    }
  }

  if (!doWrite) goto bailout;

  if (sf.num != 1 || sf.denom != 1)
    snprintf(sizeStr, 24, "%d_%d", sf.num, sf.denom);
  else if (tilew != w || tileh != h)
    snprintf(sizeStr, 24, "%dx%d", tilew, tileh);
  else snprintf(sizeStr, 24, "full");
  if (decompOnly)
    snprintf(tempStr, 1024, "%s_%s.%s", fileName, sizeStr, ext);
  else
    snprintf(tempStr, 1024, "%s_%s%s_%s.%s", fileName, subName[subsamp],
             qualStr, sizeStr, ext);

  if (tjSaveImage(tempStr, dstBuf, scaledw, 0, scaledh, pf, flags) == -1)
    THROW_TJG("saving bitmap");
  ptr = strrchr(tempStr, '.');
  snprintf(ptr, 1024 - (ptr - tempStr), "-err.%s", ext);
  if (srcBuf && sf.num == 1 && sf.denom == 1) {
    if (!quiet) printf("Compression error written to %s.\n", tempStr);
    if (subsamp == TJ_GRAYSCALE) {
      unsigned long index, index2;

      for (row = 0, index = 0; row < h; row++, index += pitch) {
        for (col = 0, index2 = index; col < w; col++, index2 += ps) {
          unsigned long rindex = index2 + tjRedOffset[pf];
          unsigned long gindex = index2 + tjGreenOffset[pf];
          unsigned long bindex = index2 + tjBlueOffset[pf];
          int y = (int)((double)srcBuf[rindex] * 0.299 +
                        (double)srcBuf[gindex] * 0.587 +
                        (double)srcBuf[bindex] * 0.114 + 0.5);

          if (y > 255) y = 255;
          if (y < 0) y = 0;
          dstBuf[rindex] = abs(dstBuf[rindex] - y);
          dstBuf[gindex] = abs(dstBuf[gindex] - y);
          dstBuf[bindex] = abs(dstBuf[bindex] - y);
        }
      }
    } else {
      for (row = 0; row < h; row++)
        for (col = 0; col < w * ps; col++)
          dstBuf[pitch * row + col] =
            abs(dstBuf[pitch * row + col] - srcBuf[pitch * row + col]);
    }
    if (tjSaveImage(tempStr, dstBuf, w, 0, h, pf, flags) == -1)
      THROW_TJG("saving bitmap");
  }

bailout:
  if (file) fclose(file);
  if (handle) tjDestroy(handle);
  if (dstBufAlloc) free(dstBuf);
  free(yuvBuf);
  return retval;
}